

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O3

void __thiscall
ut::registry::add_test<agge::tests::ParallelExecutionTests>
          (registry *this,offset_in_ParallelExecutionTests_to_subr method,char *name)

{
  undefined8 __n;
  undefined8 uVar1;
  undefined8 uVar2;
  registry *this_00;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  uint *puVar5;
  char *in_RCX;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  allocator local_c9;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  char *local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr p_Stack_70;
  registry *local_68;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  _Base_ptr local_40;
  uint *local_38;
  
  get_setup<agge::tests::ParallelExecutionTests>((registry *)local_a8);
  p_Var3 = (_Base_ptr)operator_new(0x38);
  std::__cxx11::string::string((string *)local_c8,in_RCX,(allocator *)&local_60);
  uVar2 = local_a8._8_8_;
  uVar1 = local_a8._0_8_;
  __n = local_c8._8_8_;
  local_78 = (_Base_ptr)local_a8._0_8_;
  p_Stack_70 = (_Base_ptr)local_a8._8_8_;
  if ((_Base_ptr)local_a8._8_8_ != (_Base_ptr)0x0) {
    *(int *)(test_case **)local_a8._8_8_ = *(int *)(test_case **)local_a8._8_8_ + 1;
  }
  *(undefined ***)p_Var3 = &PTR__test_case_impl_001c2c48;
  p_Var3->_M_parent = (_Base_ptr)method;
  p_Var3->_M_left = (_Base_ptr)name;
  local_68 = this;
  p_Var4 = (_Base_ptr)operator_new__(local_c8._8_8_ + 1);
  p_Var3->_M_right = p_Var4;
  if ((uint *)__n != (uint *)0x0) {
    memmove(p_Var4,(void *)local_c8._0_8_,__n);
  }
  *(undefined1 *)((long)&p_Var4->_M_color + __n) = 0;
  *(code **)(p_Var3 + 1) = exportable::immutable_basic_string<char>::deallocate;
  p_Var3[1]._M_parent = (_Base_ptr)uVar1;
  p_Var3[1]._M_left = (_Base_ptr)uVar2;
  if ((_Base_ptr)uVar2 != (_Base_ptr)0x0) {
    *(int *)(test_case **)uVar2 = *(int *)(test_case **)uVar2 + 1;
  }
  local_40 = p_Var3;
  puVar5 = (uint *)operator_new(4);
  this_00 = local_68;
  *puVar5 = 1;
  local_38 = puVar5;
  if (((_Base_ptr)uVar2 != (_Base_ptr)0x0) &&
     (*(int *)(test_case **)uVar2 = *(int *)(test_case **)uVar2 + -1,
     *(int *)(test_case **)uVar2 == 0)) {
    if ((_Base_ptr)uVar1 != (_Base_ptr)0x0) {
      (**(code **)(*(long *)uVar1 + 8))(uVar1);
    }
    operator_delete((void *)uVar2);
  }
  local_78 = (_Base_ptr)0x0;
  p_Stack_70 = (_Base_ptr)0x0;
  p_Var4 = (_Base_ptr)(local_c8 + 0x10);
  if ((_Base_ptr)local_c8._0_8_ != p_Var4) {
    operator_delete((void *)local_c8._0_8_);
  }
  (**(code **)(*(long *)p_Var3 + 0x10))(&local_88,p_Var3);
  std::__cxx11::string::string((string *)&local_60,local_88,&local_c9);
  (**(code **)(*(long *)p_Var3 + 0x18))(local_a8 + 0x10,p_Var3);
  local_c8._0_8_ = p_Var4;
  std::__cxx11::string::_M_construct<char*>((string *)local_c8,local_60,local_60 + local_58);
  std::__cxx11::string::append(local_c8);
  pVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_insert_unique(&(this_00->_registered_names)._M_t,(value_type *)local_c8);
  if ((_Base_ptr)local_c8._0_8_ != p_Var4) {
    operator_delete((void *)local_c8._0_8_);
  }
  (*(code *)local_a8._24_8_)(local_a8._16_8_);
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  (*(code *)local_80)(local_88);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    *puVar5 = *puVar5 + 1;
    local_c8._0_8_ = p_Var3;
    local_c8._8_8_ = puVar5;
    std::
    vector<ut::shared_ptr<ut::test_case,_unsigned_int>,_std::allocator<ut::shared_ptr<ut::test_case,_unsigned_int>_>_>
    ::push_back(&this_00->_test_cases,(value_type *)local_c8);
    if (((uint *)local_c8._8_8_ != (uint *)0x0) &&
       (*(uint *)local_c8._8_8_ = *(uint *)local_c8._8_8_ - 1, *(uint *)local_c8._8_8_ == 0)) {
      if ((_Base_ptr)local_c8._0_8_ != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_c8._0_8_ + 8))(local_c8._0_8_);
      }
      operator_delete((void *)local_c8._8_8_);
    }
  }
  *puVar5 = *puVar5 - 1;
  if (*puVar5 == 0) {
    (**(code **)(*(long *)p_Var3 + 8))(p_Var3);
    operator_delete(puVar5);
  }
  if (((_Base_ptr)local_a8._8_8_ != (_Base_ptr)0x0) &&
     (*(int *)(test_case **)local_a8._8_8_ = *(int *)(test_case **)local_a8._8_8_ + -1,
     *(int *)(test_case **)local_a8._8_8_ == 0)) {
    if ((_Base_ptr)local_a8._0_8_ != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))(local_a8._0_8_);
    }
    operator_delete((void *)local_a8._8_8_);
  }
  return;
}

Assistant:

inline void registry::add_test(void (FixtureT::*method)(), const char *name)
	{
		typedef test_case_impl<FixtureT> test_case;
		typedef setup_impl<FixtureT> fixture_setup;

		shared_ptr<fixture_setup> setup(get_setup<FixtureT>());
		shared_ptr<test_case> tc(new test_case_impl<FixtureT>(method, name, setup));

		if (_registered_names.insert(std::string(tc->fixture_name().c_str()) + tc->name().c_str()).second)
			_test_cases.push_back(tc);
	}